

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::BinaryRegistryReader
          (BinaryRegistryReader *this,Archive *archive,string *srcPath)

{
  pointer pcVar1;
  
  this->m_archive = archive;
  (this->m_srcPath)._M_dataplus._M_p = (pointer)&(this->m_srcPath).field_2;
  pcVar1 = (srcPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_srcPath,pcVar1,pcVar1 + srcPath->_M_string_length);
  (this->m_binaryIndex).
  super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  .m_data.ptr = (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *)0x0;
  return;
}

Assistant:

BinaryRegistryReader::BinaryRegistryReader (const tcu::Archive& archive, const std::string& srcPath)
	: m_archive	(archive)
	, m_srcPath	(srcPath)
{
}